

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O0

string * __thiscall
booster::locale::impl_icu::raii_casemap::
convert<int(*)(UCaseMap*,char*,int,char_const*,int,UErrorCode*)>
          (raii_casemap *this,_func_int_UCaseMap_ptr_char_ptr_int_char_ptr_int_UErrorCode_ptr *func,
          char *begin,char *end)

{
  code *pcVar1;
  reference pvVar2;
  size_type sVar3;
  ulong uVar4;
  undefined8 in_RCX;
  code *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  int in_R8D;
  int size;
  UErrorCode err;
  vector<char,_std::allocator<char>_> buf;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff20;
  allocator *this_00;
  size_type in_stack_ffffffffffffff28;
  vector<char,_std::allocator<char>_> *this_01;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined8 uVar5;
  allocator local_5d;
  int local_5c;
  int local_58 [5];
  allocator<char> local_41;
  vector<char,_std::allocator<char>_> local_40;
  int local_28;
  undefined8 local_20;
  code *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = in_R8D;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<char>::~allocator(&local_41);
  pcVar1 = local_18;
  local_58[0] = 0;
  uVar5 = *in_RSI;
  pvVar2 = std::vector<char,_std::allocator<char>_>::front(in_stack_ffffffffffffff10);
  sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_40);
  local_5c = (*pcVar1)(uVar5,pvVar2,sVar3 & 0xffffffff,local_20,local_28 - (int)local_20,local_58);
  if (local_58[0] == 0xf) {
    local_58[0] = 0;
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    uVar5 = *in_RSI;
    this_01 = &local_40;
    pvVar2 = std::vector<char,_std::allocator<char>_>::front(in_stack_ffffffffffffff10);
    sVar3 = std::vector<char,_std::allocator<char>_>::size(this_01);
    local_5c = (*local_18)(uVar5,pvVar2,sVar3 & 0xffffffff,local_20,local_28 - (int)local_20,
                           local_58);
  }
  check_and_throw_icu_error(U_ZERO_ERROR);
  pvVar2 = std::vector<char,_std::allocator<char>_>::front(in_stack_ffffffffffffff10);
  uVar4 = (ulong)local_5c;
  this_00 = &local_5d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pvVar2,uVar4,this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)this_00);
  return in_RDI;
}

Assistant:

std::string convert(Conv func,char const *begin,char const *end) const
        {
                std::vector<char> buf((end-begin)*11/10+1);
                UErrorCode err=U_ZERO_ERROR;
                int size = func(map_,&buf.front(),buf.size(),begin,end-begin,&err);
                if(err == U_BUFFER_OVERFLOW_ERROR) {
                    err = U_ZERO_ERROR;
                    buf.resize(size+1);
                    size = func(map_,&buf.front(),buf.size(),begin,end-begin,&err);
                }
                check_and_throw_icu_error(err);
                return std::string(&buf.front(),size);
        }